

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O1

char * despot::util::tinyxml::TiXmlBase::ReadText
                 (char *p,TiXmlString *text,bool trimWhiteSpace,char *endTag,bool caseInsensitive,
                 TiXmlEncoding encoding)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  byte bVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  size_type len_00;
  ulong uVar8;
  uint *str;
  byte *pbVar9;
  char cArr [4];
  int len;
  uint local_40;
  uint local_3c;
  undefined1 local_35;
  uint local_34;
  
  TiXmlString::assign(text,"",0);
  if (((int)CONCAT71(in_register_00000011,trimWhiteSpace) == 0) || (condenseWhiteSpace == '\0')) {
    if (p != (char *)0x0) {
      do {
        if ((*p == 0) || (bVar2 = StringEqual(p,endTag,caseInsensitive,encoding), bVar2))
        goto LAB_001735d8;
        local_40 = 0;
        uVar4 = 1;
        if (encoding == TIXML_ENCODING_UTF8) {
          uVar4 = *(uint *)(utf8ByteTable + (ulong)(byte)*p * 4);
        }
        local_3c = uVar4;
        if (uVar4 == 0) {
          p = (char *)0x0;
        }
        else if (uVar4 == 1) {
          if (*p == 0x26) {
            p = GetEntity(p,(char *)&local_40,(int *)&local_3c,encoding);
          }
          else {
            local_40 = (uint)(byte)*p;
            p = (char *)((byte *)p + 1);
          }
        }
        else {
          bVar6 = *p;
          if (bVar6 != 0) {
            uVar7 = 0;
            if (0 < (int)uVar4) {
              uVar7 = (ulong)uVar4;
            }
            uVar8 = 0;
            do {
              if (uVar7 == uVar8) break;
              *(byte *)((long)&local_40 + uVar8) = bVar6;
              bVar6 = ((byte *)p)[uVar8 + 1];
              uVar8 = uVar8 + 1;
            } while (bVar6 != 0);
          }
          p = (char *)((byte *)p + (int)uVar4);
        }
        TiXmlString::append(text,(char *)&local_40,(long)(int)local_3c);
      } while ((byte *)p != (byte *)0x0);
    }
    p = (char *)0x0;
  }
  else {
    p = SkipWhiteSpace(p,encoding);
    if ((byte *)p != (byte *)0x0) {
      bVar2 = false;
      local_34 = (uint)caseInsensitive;
      do {
        if ((*p == 0) || (bVar1 = StringEqual(p,endTag,SUB41(local_34,0),encoding), bVar1)) break;
        bVar6 = *p;
        if (((bVar6 == 0xd) ||
            (((bVar6 == 10 || (iVar3 = isspace((uint)bVar6), iVar3 != 0)) || (bVar6 == 0xd)))) ||
           (bVar6 == 10)) {
          p = (char *)((byte *)p + 1);
          bVar2 = true;
        }
        else {
          if (bVar2) {
            local_3c = CONCAT31(local_3c._1_3_,0x20);
            TiXmlString::append(text,(char *)&local_3c,1);
            bVar2 = false;
          }
          local_40 = 0;
          uVar4 = 1;
          if (encoding == TIXML_ENCODING_UTF8) {
            uVar4 = *(uint *)(utf8ByteTable + (ulong)(byte)*p * 4);
          }
          local_3c = uVar4;
          if (uVar4 == 0) {
            p = (char *)0x0;
          }
          else if (uVar4 == 1) {
            if (*p == 0x26) {
              p = GetEntity(p,(char *)&local_40,(int *)&local_3c,encoding);
            }
            else {
              local_40 = (uint)(byte)*p;
              p = (char *)((byte *)p + 1);
            }
          }
          else {
            bVar6 = *p;
            if (bVar6 != 0) {
              uVar7 = 0;
              if (0 < (int)uVar4) {
                uVar7 = (ulong)uVar4;
              }
              uVar8 = 0;
              do {
                if (uVar7 == uVar8) break;
                *(byte *)((long)&local_40 + uVar8) = bVar6;
                bVar6 = ((byte *)p)[uVar8 + 1];
                uVar8 = uVar8 + 1;
              } while (bVar6 != 0);
            }
            p = (char *)((byte *)p + (int)uVar4);
          }
          len_00 = (size_type)(int)local_3c;
          if (len_00 == 1) {
            local_35 = (undefined1)local_40;
            len_00 = 1;
            str = (uint *)&local_35;
          }
          else {
            str = &local_40;
          }
          TiXmlString::append(text,(char *)str,len_00);
        }
      } while ((byte *)p != (byte *)0x0);
    }
  }
LAB_001735d8:
  if ((byte *)p == (byte *)0x0) {
    pbVar9 = (byte *)0x0;
  }
  else {
    sVar5 = strlen(endTag);
    pbVar9 = (byte *)p + sVar5;
  }
  return (char *)pbVar9;
}

Assistant:

const char* TiXmlBase::ReadText(const char* p, TIXML_STRING * text,
	bool trimWhiteSpace, const char* endTag, bool caseInsensitive,
	TiXmlEncoding encoding) {
	*text = "";
	if (!trimWhiteSpace // certain tags always keep whitespace
	|| !condenseWhiteSpace) // if true, whitespace is always kept
		{
		// Keep all the white space.
		while (p && *p && !StringEqual(p, endTag, caseInsensitive, encoding)) {
			int len;
			char cArr[4] = { 0, 0, 0, 0 };
			p = GetChar(p, cArr, &len, encoding);
			text->append(cArr, len);
		}
	} else {
		bool whitespace = false;

		// Remove leading white space:
		p = SkipWhiteSpace(p, encoding);
		while (p && *p && !StringEqual(p, endTag, caseInsensitive, encoding)) {
			if (*p == '\r' || *p == '\n') {
				whitespace = true;
				++p;
			} else if (IsWhiteSpace(*p)) {
				whitespace = true;
				++p;
			} else {
				// If we've found whitespace, add it before the
				// new character. Any whitespace just becomes a space.
				if (whitespace) {
					(*text) += ' ';
					whitespace = false;
				}
				int len;
				char cArr[4] = { 0, 0, 0, 0 };
				p = GetChar(p, cArr, &len, encoding);
				if (len == 1)
					(*text) += cArr[0]; // more efficient
				else
					text->append(cArr, len);
			}
		}
	}
	if (p)
		p += strlen(endTag);
	return p;
}